

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [32];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  byte bVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  AABBNodeMB4D *node1;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar48;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar67 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar68 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  float fVar87;
  undefined1 auVar86 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  float fVar96;
  undefined1 auVar97 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [64];
  undefined1 auVar102 [16];
  uint uVar104;
  uint uVar105;
  uint uVar106;
  undefined1 auVar103 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  float fVar110;
  float fVar116;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar114;
  float fVar115;
  undefined1 auVar113 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_149c;
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  RTCIntersectArguments *local_1470;
  long local_1468;
  RayQueryContext *local_1460;
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  long local_1430;
  long local_1428;
  long local_1420;
  ulong local_1418;
  ulong *local_1410;
  uint local_1408;
  uint local_1404;
  uint local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  RTCFilterFunctionNArguments local_13d8;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar48 = ray->tfar;
    auVar78 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar48) {
      local_1460 = context;
      aVar4 = (ray->dir).field_0;
      auVar56 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar84._8_4_ = 0x7fffffff;
      auVar84._0_8_ = 0x7fffffff7fffffff;
      auVar84._12_4_ = 0x7fffffff;
      auVar84 = vandps_avx((undefined1  [16])aVar4,auVar84);
      auVar88._8_4_ = 0x219392ef;
      auVar88._0_8_ = 0x219392ef219392ef;
      auVar88._12_4_ = 0x219392ef;
      auVar84 = vcmpps_avx(auVar84,auVar88,1);
      auVar84 = vblendvps_avx((undefined1  [16])aVar4,auVar88,auVar84);
      local_1410 = local_11d8 + 1;
      auVar88 = vrcpps_avx(auVar84);
      fVar53 = auVar88._0_4_;
      auVar79._0_4_ = fVar53 * auVar84._0_4_;
      fVar54 = auVar88._4_4_;
      auVar79._4_4_ = fVar54 * auVar84._4_4_;
      fVar55 = auVar88._8_4_;
      auVar79._8_4_ = fVar55 * auVar84._8_4_;
      fVar87 = auVar88._12_4_;
      auVar79._12_4_ = fVar87 * auVar84._12_4_;
      auVar89._8_4_ = 0x3f800000;
      auVar89._0_8_ = 0x3f8000003f800000;
      auVar89._12_4_ = 0x3f800000;
      auVar84 = vsubps_avx(auVar89,auVar79);
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar3;
      local_11f8._0_4_ = uVar3;
      local_11f8._8_4_ = uVar3;
      local_11f8._12_4_ = uVar3;
      local_11f8._16_4_ = uVar3;
      local_11f8._20_4_ = uVar3;
      local_11f8._24_4_ = uVar3;
      local_11f8._28_4_ = uVar3;
      auVar93 = ZEXT3264(local_11f8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar3;
      local_1218._0_4_ = uVar3;
      local_1218._8_4_ = uVar3;
      local_1218._12_4_ = uVar3;
      local_1218._16_4_ = uVar3;
      local_1218._20_4_ = uVar3;
      local_1218._24_4_ = uVar3;
      local_1218._28_4_ = uVar3;
      auVar95 = ZEXT3264(local_1218);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar3;
      local_1238._0_4_ = uVar3;
      local_1238._8_4_ = uVar3;
      local_1238._12_4_ = uVar3;
      local_1238._16_4_ = uVar3;
      local_1238._20_4_ = uVar3;
      local_1238._24_4_ = uVar3;
      local_1238._28_4_ = uVar3;
      auVar98 = ZEXT3264(local_1238);
      auVar80._0_4_ = fVar53 + fVar53 * auVar84._0_4_;
      auVar80._4_4_ = fVar54 + fVar54 * auVar84._4_4_;
      auVar80._8_4_ = fVar55 + fVar55 * auVar84._8_4_;
      auVar80._12_4_ = fVar87 + fVar87 * auVar84._12_4_;
      auVar84 = vshufps_avx(auVar80,auVar80,0);
      local_1258._16_16_ = auVar84;
      local_1258._0_16_ = auVar84;
      auVar103 = ZEXT3264(local_1258);
      auVar84 = vmovshdup_avx(auVar80);
      auVar86 = ZEXT1664(auVar84);
      auVar88 = vshufps_avx(auVar80,auVar80,0x55);
      local_1278._16_16_ = auVar88;
      local_1278._0_16_ = auVar88;
      auVar108 = ZEXT3264(local_1278);
      auVar88 = vshufpd_avx(auVar80,auVar80,1);
      auVar79 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar83 = ZEXT1664(auVar79);
      local_1298._16_16_ = auVar79;
      local_1298._0_16_ = auVar79;
      auVar109 = ZEXT3264(local_1298);
      local_1418 = (ulong)(auVar80._0_4_ < 0.0) << 5;
      uVar45 = (ulong)(auVar84._0_4_ < 0.0) << 5 | 0x40;
      uVar44 = (ulong)(auVar88._0_4_ < 0.0) << 5 | 0x80;
      uVar46 = local_1418 ^ 0x20;
      auVar84 = vshufps_avx(auVar56,auVar56,0);
      auVar68 = ZEXT1664(auVar84);
      local_12b8._16_16_ = auVar84;
      local_12b8._0_16_ = auVar84;
      auVar91 = ZEXT3264(local_12b8);
      auVar84 = vshufps_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),0);
      local_12d8._16_16_ = auVar84;
      local_12d8._0_16_ = auVar84;
      auVar113 = ZEXT3264(local_12d8);
      local_13a8 = mm_lookupmask_ps._240_8_;
      uStack_13a0 = mm_lookupmask_ps._248_8_;
LAB_00e5c9d5:
      if (local_1410 != local_11d8) {
        uVar47 = local_1410[-1];
        local_1410 = local_1410 + -1;
        do {
          fVar48 = (ray->dir).field_0.m128[3];
          auVar52._4_4_ = fVar48;
          auVar52._0_4_ = fVar48;
          auVar52._8_4_ = fVar48;
          auVar52._12_4_ = fVar48;
          auVar52._16_4_ = fVar48;
          auVar52._20_4_ = fVar48;
          auVar52._24_4_ = fVar48;
          auVar52._28_4_ = fVar48;
          do {
            if ((uVar47 & 8) != 0) {
              local_1420 = (ulong)((uint)uVar47 & 0xf) - 8;
              uVar47 = uVar47 & 0xfffffffffffffff0;
              local_1428 = 0;
              goto LAB_00e5cb7c;
            }
            uVar39 = uVar47 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar39 + 0x100 + local_1418);
            pfVar1 = (float *)(uVar39 + 0x40 + local_1418);
            auVar67._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar67._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar67._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar67._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            auVar67._16_4_ = fVar48 * pfVar2[4] + pfVar1[4];
            auVar67._20_4_ = fVar48 * pfVar2[5] + pfVar1[5];
            auVar67._24_4_ = fVar48 * pfVar2[6] + pfVar1[6];
            auVar67._28_4_ = auVar68._28_4_ + pfVar1[7];
            auVar67 = vsubps_avx(auVar67,auVar93._0_32_);
            auVar32._4_4_ = auVar103._4_4_ * auVar67._4_4_;
            auVar32._0_4_ = auVar103._0_4_ * auVar67._0_4_;
            auVar32._8_4_ = auVar103._8_4_ * auVar67._8_4_;
            auVar32._12_4_ = auVar103._12_4_ * auVar67._12_4_;
            auVar32._16_4_ = auVar103._16_4_ * auVar67._16_4_;
            auVar32._20_4_ = auVar103._20_4_ * auVar67._20_4_;
            auVar32._24_4_ = auVar103._24_4_ * auVar67._24_4_;
            auVar32._28_4_ = auVar67._28_4_;
            auVar67 = vmaxps_avx(auVar91._0_32_,auVar32);
            pfVar2 = (float *)(uVar39 + 0x100 + uVar45);
            pfVar1 = (float *)(uVar39 + 0x40 + uVar45);
            auVar76._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar76._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar76._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar76._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            auVar76._16_4_ = fVar48 * pfVar2[4] + pfVar1[4];
            auVar76._20_4_ = fVar48 * pfVar2[5] + pfVar1[5];
            auVar76._24_4_ = fVar48 * pfVar2[6] + pfVar1[6];
            auVar76._28_4_ = auVar78._28_4_ + pfVar1[7];
            auVar32 = vsubps_avx(auVar76,auVar95._0_32_);
            auVar5._4_4_ = auVar108._4_4_ * auVar32._4_4_;
            auVar5._0_4_ = auVar108._0_4_ * auVar32._0_4_;
            auVar5._8_4_ = auVar108._8_4_ * auVar32._8_4_;
            auVar5._12_4_ = auVar108._12_4_ * auVar32._12_4_;
            auVar5._16_4_ = auVar108._16_4_ * auVar32._16_4_;
            auVar5._20_4_ = auVar108._20_4_ * auVar32._20_4_;
            auVar5._24_4_ = auVar108._24_4_ * auVar32._24_4_;
            auVar5._28_4_ = auVar32._28_4_;
            pfVar2 = (float *)(uVar39 + 0x100 + uVar44);
            pfVar1 = (float *)(uVar39 + 0x40 + uVar44);
            auVar81._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar81._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar81._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar81._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            auVar81._16_4_ = fVar48 * pfVar2[4] + pfVar1[4];
            auVar81._20_4_ = fVar48 * pfVar2[5] + pfVar1[5];
            auVar81._24_4_ = fVar48 * pfVar2[6] + pfVar1[6];
            auVar81._28_4_ = auVar83._28_4_ + pfVar1[7];
            auVar33 = vsubps_avx(auVar81,auVar98._0_32_);
            auVar35._4_4_ = auVar109._4_4_ * auVar33._4_4_;
            auVar35._0_4_ = auVar109._0_4_ * auVar33._0_4_;
            auVar35._8_4_ = auVar109._8_4_ * auVar33._8_4_;
            auVar35._12_4_ = auVar109._12_4_ * auVar33._12_4_;
            auVar35._16_4_ = auVar109._16_4_ * auVar33._16_4_;
            auVar35._20_4_ = auVar109._20_4_ * auVar33._20_4_;
            auVar35._24_4_ = auVar109._24_4_ * auVar33._24_4_;
            auVar35._28_4_ = auVar33._28_4_;
            auVar32 = vmaxps_avx(auVar5,auVar35);
            auVar67 = vmaxps_avx(auVar67,auVar32);
            pfVar2 = (float *)(uVar39 + 0x100 + uVar46);
            pfVar1 = (float *)(uVar39 + 0x40 + uVar46);
            auVar77._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar77._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar77._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar77._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            auVar77._16_4_ = fVar48 * pfVar2[4] + pfVar1[4];
            auVar77._20_4_ = fVar48 * pfVar2[5] + pfVar1[5];
            auVar77._24_4_ = fVar48 * pfVar2[6] + pfVar1[6];
            auVar77._28_4_ = auVar32._28_4_ + pfVar1[7];
            auVar32 = vsubps_avx(auVar77,auVar93._0_32_);
            auVar36._4_4_ = auVar103._4_4_ * auVar32._4_4_;
            auVar36._0_4_ = auVar103._0_4_ * auVar32._0_4_;
            auVar36._8_4_ = auVar103._8_4_ * auVar32._8_4_;
            auVar36._12_4_ = auVar103._12_4_ * auVar32._12_4_;
            auVar36._16_4_ = auVar103._16_4_ * auVar32._16_4_;
            auVar36._20_4_ = auVar103._20_4_ * auVar32._20_4_;
            auVar36._24_4_ = auVar103._24_4_ * auVar32._24_4_;
            auVar36._28_4_ = auVar32._28_4_;
            pfVar2 = (float *)(uVar39 + 0x100 + (uVar45 ^ 0x20));
            auVar5 = vminps_avx(auVar113._0_32_,auVar36);
            pfVar1 = (float *)(uVar39 + 0x40 + (uVar45 ^ 0x20));
            auVar82._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar82._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar82._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar82._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            auVar82._16_4_ = fVar48 * pfVar2[4] + pfVar1[4];
            auVar82._20_4_ = fVar48 * pfVar2[5] + pfVar1[5];
            auVar82._24_4_ = fVar48 * pfVar2[6] + pfVar1[6];
            auVar82._28_4_ = auVar33._28_4_ + pfVar1[7];
            auVar32 = vsubps_avx(auVar82,auVar95._0_32_);
            pfVar2 = (float *)(uVar39 + 0x100 + (uVar44 ^ 0x20));
            pfVar1 = (float *)(uVar39 + 0x40 + (uVar44 ^ 0x20));
            auVar85._0_4_ = fVar48 * *pfVar2 + *pfVar1;
            auVar85._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
            auVar85._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar85._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
            auVar85._16_4_ = fVar48 * pfVar2[4] + pfVar1[4];
            auVar85._20_4_ = fVar48 * pfVar2[5] + pfVar1[5];
            auVar85._24_4_ = fVar48 * pfVar2[6] + pfVar1[6];
            auVar85._28_4_ = auVar86._28_4_ + pfVar1[7];
            auVar33._4_4_ = auVar108._4_4_ * auVar32._4_4_;
            auVar33._0_4_ = auVar108._0_4_ * auVar32._0_4_;
            auVar33._8_4_ = auVar108._8_4_ * auVar32._8_4_;
            auVar33._12_4_ = auVar108._12_4_ * auVar32._12_4_;
            auVar33._16_4_ = auVar108._16_4_ * auVar32._16_4_;
            auVar33._20_4_ = auVar108._20_4_ * auVar32._20_4_;
            auVar33._24_4_ = auVar108._24_4_ * auVar32._24_4_;
            auVar33._28_4_ = auVar32._28_4_;
            auVar32 = vsubps_avx(auVar85,auVar98._0_32_);
            auVar37._4_4_ = auVar109._4_4_ * auVar32._4_4_;
            auVar37._0_4_ = auVar109._0_4_ * auVar32._0_4_;
            auVar37._8_4_ = auVar109._8_4_ * auVar32._8_4_;
            auVar37._12_4_ = auVar109._12_4_ * auVar32._12_4_;
            auVar37._16_4_ = auVar109._16_4_ * auVar32._16_4_;
            auVar37._20_4_ = auVar109._20_4_ * auVar32._20_4_;
            auVar37._24_4_ = auVar109._24_4_ * auVar32._24_4_;
            auVar37._28_4_ = auVar32._28_4_;
            auVar86 = ZEXT3264(auVar37);
            auVar32 = vminps_avx(auVar33,auVar37);
            auVar5 = vminps_avx(auVar5,auVar32);
            auVar67 = vcmpps_avx(auVar67,auVar5,2);
            if (((uint)uVar47 & 7) == 6) {
              auVar5 = vcmpps_avx(*(undefined1 (*) [32])(uVar39 + 0x1c0),auVar52,2);
              auVar32 = vcmpps_avx(auVar52,*(undefined1 (*) [32])(uVar39 + 0x1e0),1);
              auVar5 = vandps_avx(auVar5,auVar32);
              auVar67 = vandps_avx(auVar5,auVar67);
            }
            auVar83 = ZEXT3264(auVar32);
            auVar84 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
            auVar56 = vpsllw_avx(auVar84,0xf);
            auVar68 = ZEXT1664(auVar56);
            auVar84 = vpacksswb_avx(auVar56,auVar56);
            auVar78 = ZEXT1664(auVar84);
            bVar34 = SUB161(auVar84 >> 7,0) & 1 | (SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar84 >> 0x17,0) & 1) << 2 | (SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar84 >> 0x27,0) & 1) << 4 | (SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar84 >> 0x37,0) & 1) << 6 | SUB161(auVar84 >> 0x3f,0) << 7;
            if ((((((((auVar56 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar56 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar56 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar56 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar56[0xf]) goto LAB_00e5c9d5;
            lVar43 = 0;
            if (bVar34 != 0) {
              for (; (bVar34 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
              }
            }
            uVar47 = *(ulong *)(uVar39 + lVar43 * 8);
            uVar41 = bVar34 - 1 & (uint)bVar34;
            uVar42 = (ulong)uVar41;
          } while (uVar41 == 0);
          do {
            *local_1410 = uVar47;
            local_1410 = local_1410 + 1;
            lVar43 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
              }
            }
            uVar47 = *(ulong *)(uVar39 + lVar43 * 8);
            uVar42 = uVar42 - 1 & uVar42;
          } while (uVar42 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00e5cb7c:
  if (local_1428 == local_1420) goto LAB_00e5c9d5;
  lVar43 = local_1428 * 0x140;
  fVar48 = (ray->dir).field_0.m128[3];
  pfVar2 = (float *)(uVar47 + 0x90 + lVar43);
  pfVar1 = (float *)(uVar47 + lVar43);
  auVar90._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar90._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar90._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar90._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar47 + 0xa0 + lVar43);
  pfVar1 = (float *)(uVar47 + 0x10 + lVar43);
  auVar92._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar92._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar92._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar92._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar47 + 0xb0 + lVar43);
  pfVar1 = (float *)(uVar47 + 0x20 + lVar43);
  auVar94._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar94._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar94._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar94._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar47 + 0xc0 + lVar43);
  pfVar1 = (float *)(uVar47 + 0x30 + lVar43);
  auVar57._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar57._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar57._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar57._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar47 + 0xd0 + lVar43);
  pfVar1 = (float *)(uVar47 + 0x40 + lVar43);
  auVar69._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar69._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar69._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar69._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar47 + 0xe0 + lVar43);
  pfVar1 = (float *)(uVar47 + 0x50 + lVar43);
  auVar97._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar97._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar97._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar97._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar47 + 0xf0 + lVar43);
  pfVar1 = (float *)(uVar47 + 0x60 + lVar43);
  auVar102._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar102._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar102._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar102._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar47 + 0x100 + lVar43);
  pfVar1 = (float *)(uVar47 + 0x70 + lVar43);
  auVar107._0_4_ = fVar48 * *pfVar2 + *pfVar1;
  auVar107._4_4_ = fVar48 * pfVar2[1] + pfVar1[1];
  auVar107._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
  auVar107._12_4_ = fVar48 * pfVar2[3] + pfVar1[3];
  pfVar1 = (float *)(uVar47 + 0x110 + lVar43);
  pfVar2 = (float *)(uVar47 + 0x80 + lVar43);
  auVar49._0_4_ = fVar48 * *pfVar1 + *pfVar2;
  auVar49._4_4_ = fVar48 * pfVar1[1] + pfVar2[1];
  auVar49._8_4_ = fVar48 * pfVar1[2] + pfVar2[2];
  auVar49._12_4_ = fVar48 * pfVar1[3] + pfVar2[3];
  local_1448 = vsubps_avx(auVar90,auVar57);
  local_1488 = vsubps_avx(auVar92,auVar69);
  auVar84 = vsubps_avx(auVar94,auVar97);
  auVar56 = vsubps_avx(auVar102,auVar90);
  auVar88 = vsubps_avx(auVar107,auVar92);
  auVar79 = vsubps_avx(auVar49,auVar94);
  fVar55 = auVar79._0_4_;
  fVar110 = local_1488._0_4_;
  auVar50._0_4_ = fVar110 * fVar55;
  fVar11 = auVar79._4_4_;
  fVar114 = local_1488._4_4_;
  auVar50._4_4_ = fVar114 * fVar11;
  fVar18 = auVar79._8_4_;
  fVar115 = local_1488._8_4_;
  auVar50._8_4_ = fVar115 * fVar18;
  fVar25 = auVar79._12_4_;
  fVar116 = local_1488._12_4_;
  auVar50._12_4_ = fVar116 * fVar25;
  fVar87 = auVar88._0_4_;
  fVar96 = auVar84._0_4_;
  auVar58._0_4_ = fVar96 * fVar87;
  fVar12 = auVar88._4_4_;
  fVar99 = auVar84._4_4_;
  auVar58._4_4_ = fVar99 * fVar12;
  fVar19 = auVar88._8_4_;
  fVar100 = auVar84._8_4_;
  auVar58._8_4_ = fVar100 * fVar19;
  fVar26 = auVar88._12_4_;
  fVar101 = auVar84._12_4_;
  auVar58._12_4_ = fVar101 * fVar26;
  local_1498 = vsubps_avx(auVar58,auVar50);
  fVar6 = auVar56._0_4_;
  auVar59._0_4_ = fVar96 * fVar6;
  fVar13 = auVar56._4_4_;
  auVar59._4_4_ = fVar99 * fVar13;
  fVar20 = auVar56._8_4_;
  auVar59._8_4_ = fVar100 * fVar20;
  fVar27 = auVar56._12_4_;
  auVar59._12_4_ = fVar101 * fVar27;
  fVar7 = local_1448._0_4_;
  auVar70._0_4_ = fVar55 * fVar7;
  fVar14 = local_1448._4_4_;
  auVar70._4_4_ = fVar11 * fVar14;
  fVar21 = local_1448._8_4_;
  auVar70._8_4_ = fVar18 * fVar21;
  fVar28 = local_1448._12_4_;
  auVar70._12_4_ = fVar25 * fVar28;
  local_12f8 = vsubps_avx(auVar70,auVar59);
  auVar71._0_4_ = fVar87 * fVar7;
  auVar71._4_4_ = fVar12 * fVar14;
  auVar71._8_4_ = fVar19 * fVar21;
  auVar71._12_4_ = fVar26 * fVar28;
  auVar111._0_4_ = fVar110 * fVar6;
  auVar111._4_4_ = fVar114 * fVar13;
  auVar111._8_4_ = fVar115 * fVar20;
  auVar111._12_4_ = fVar116 * fVar27;
  local_1458 = vsubps_avx(auVar111,auVar71);
  uVar3 = *(undefined4 *)&(ray->org).field_0;
  auVar112._4_4_ = uVar3;
  auVar112._0_4_ = uVar3;
  auVar112._8_4_ = uVar3;
  auVar112._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar117._4_4_ = uVar3;
  auVar117._0_4_ = uVar3;
  auVar117._8_4_ = uVar3;
  auVar117._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar119._4_4_ = uVar3;
  auVar119._0_4_ = uVar3;
  auVar119._8_4_ = uVar3;
  auVar119._12_4_ = uVar3;
  fVar48 = (ray->dir).field_0.m128[1];
  auVar84 = vsubps_avx(auVar90,auVar112);
  fVar53 = (ray->dir).field_0.m128[2];
  auVar56 = vsubps_avx(auVar92,auVar117);
  auVar88 = vsubps_avx(auVar94,auVar119);
  fVar8 = auVar88._0_4_;
  auVar118._0_4_ = fVar48 * fVar8;
  fVar15 = auVar88._4_4_;
  auVar118._4_4_ = fVar48 * fVar15;
  fVar22 = auVar88._8_4_;
  auVar118._8_4_ = fVar48 * fVar22;
  fVar29 = auVar88._12_4_;
  auVar118._12_4_ = fVar48 * fVar29;
  fVar9 = auVar56._0_4_;
  auVar120._0_4_ = fVar53 * fVar9;
  fVar16 = auVar56._4_4_;
  auVar120._4_4_ = fVar53 * fVar16;
  fVar23 = auVar56._8_4_;
  auVar120._8_4_ = fVar53 * fVar23;
  fVar30 = auVar56._12_4_;
  auVar120._12_4_ = fVar53 * fVar30;
  auVar56 = vsubps_avx(auVar120,auVar118);
  fVar54 = (ray->dir).field_0.m128[0];
  fVar10 = auVar84._0_4_;
  auVar51._0_4_ = fVar53 * fVar10;
  fVar17 = auVar84._4_4_;
  auVar51._4_4_ = fVar53 * fVar17;
  fVar24 = auVar84._8_4_;
  auVar51._8_4_ = fVar53 * fVar24;
  fVar31 = auVar84._12_4_;
  auVar51._12_4_ = fVar53 * fVar31;
  auVar60._0_4_ = fVar54 * fVar8;
  auVar60._4_4_ = fVar54 * fVar15;
  auVar60._8_4_ = fVar54 * fVar22;
  auVar60._12_4_ = fVar54 * fVar29;
  auVar88 = vsubps_avx(auVar60,auVar51);
  auVar61._0_4_ = fVar54 * fVar9;
  auVar61._4_4_ = fVar54 * fVar16;
  auVar61._8_4_ = fVar54 * fVar23;
  auVar61._12_4_ = fVar54 * fVar30;
  auVar72._0_4_ = fVar48 * fVar10;
  auVar72._4_4_ = fVar48 * fVar17;
  auVar72._8_4_ = fVar48 * fVar24;
  auVar72._12_4_ = fVar48 * fVar31;
  auVar79 = vsubps_avx(auVar72,auVar61);
  auVar80 = local_1458;
  auVar73._0_4_ = fVar54 * local_1498._0_4_ + fVar48 * local_12f8._0_4_ + fVar53 * local_1458._0_4_;
  auVar73._4_4_ = fVar54 * local_1498._4_4_ + fVar48 * local_12f8._4_4_ + fVar53 * local_1458._4_4_;
  auVar73._8_4_ = fVar54 * local_1498._8_4_ + fVar48 * local_12f8._8_4_ + fVar53 * local_1458._8_4_;
  auVar73._12_4_ =
       fVar54 * local_1498._12_4_ + fVar48 * local_12f8._12_4_ + fVar53 * local_1458._12_4_;
  auVar78 = ZEXT1664(auVar73);
  auVar62._8_8_ = 0x8000000080000000;
  auVar62._0_8_ = 0x8000000080000000;
  auVar84 = vandps_avx(auVar73,auVar62);
  uVar41 = auVar84._0_4_;
  local_1398._0_4_ =
       (float)(uVar41 ^ (uint)(fVar6 * auVar56._0_4_ +
                              fVar87 * auVar88._0_4_ + fVar55 * auVar79._0_4_));
  uVar104 = auVar84._4_4_;
  local_1398._4_4_ =
       (float)(uVar104 ^
              (uint)(fVar13 * auVar56._4_4_ + fVar12 * auVar88._4_4_ + fVar11 * auVar79._4_4_));
  uVar105 = auVar84._8_4_;
  local_1398._8_4_ =
       (float)(uVar105 ^
              (uint)(fVar20 * auVar56._8_4_ + fVar19 * auVar88._8_4_ + fVar18 * auVar79._8_4_));
  uVar106 = auVar84._12_4_;
  local_1398._12_4_ =
       (float)(uVar106 ^
              (uint)(fVar27 * auVar56._12_4_ + fVar26 * auVar88._12_4_ + fVar25 * auVar79._12_4_));
  auVar83 = ZEXT1664(local_1398);
  local_1388._0_4_ =
       (float)(uVar41 ^ (uint)(auVar56._0_4_ * fVar7 +
                              auVar88._0_4_ * fVar110 + fVar96 * auVar79._0_4_));
  local_1388._4_4_ =
       (float)(uVar104 ^
              (uint)(auVar56._4_4_ * fVar14 + auVar88._4_4_ * fVar114 + fVar99 * auVar79._4_4_));
  local_1388._8_4_ =
       (float)(uVar105 ^
              (uint)(auVar56._8_4_ * fVar21 + auVar88._8_4_ * fVar115 + fVar100 * auVar79._8_4_));
  local_1388._12_4_ =
       (float)(uVar106 ^
              (uint)(auVar56._12_4_ * fVar28 + auVar88._12_4_ * fVar116 + fVar101 * auVar79._12_4_))
  ;
  auVar86 = ZEXT1664(local_1388);
  auVar88 = ZEXT416(0) << 0x20;
  auVar84 = vcmpps_avx(local_1398,auVar88,5);
  auVar56 = vcmpps_avx(local_1388,auVar88,5);
  auVar84 = vandps_avx(auVar84,auVar56);
  auVar63._8_4_ = 0x7fffffff;
  auVar63._0_8_ = 0x7fffffff7fffffff;
  auVar63._12_4_ = 0x7fffffff;
  local_1368 = vandps_avx(auVar73,auVar63);
  auVar56 = vcmpps_avx(auVar88,auVar73,4);
  auVar84 = vandps_avx(auVar84,auVar56);
  auVar64._0_4_ = local_1398._0_4_ + local_1388._0_4_;
  auVar64._4_4_ = local_1398._4_4_ + local_1388._4_4_;
  auVar64._8_4_ = local_1398._8_4_ + local_1388._8_4_;
  auVar64._12_4_ = local_1398._12_4_ + local_1388._12_4_;
  auVar56 = vcmpps_avx(auVar64,local_1368,2);
  auVar68 = ZEXT1664(auVar56);
  auVar84 = vandps_avx(auVar84,auVar56);
  auVar56._8_8_ = uStack_13a0;
  auVar56._0_8_ = local_13a8;
  auVar56 = auVar56 & auVar84;
  if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar56[0xf] < '\0') {
    auVar38._8_8_ = uStack_13a0;
    auVar38._0_8_ = local_13a8;
    auVar84 = vandps_avx(auVar84,auVar38);
    local_1378._0_4_ =
         (float)(uVar41 ^ (uint)(local_1498._0_4_ * fVar10 +
                                local_12f8._0_4_ * fVar9 + fVar8 * local_1458._0_4_));
    local_1378._4_4_ =
         (float)(uVar104 ^
                (uint)(local_1498._4_4_ * fVar17 +
                      local_12f8._4_4_ * fVar16 + fVar15 * local_1458._4_4_));
    local_1378._8_4_ =
         (float)(uVar105 ^
                (uint)(local_1498._8_4_ * fVar24 +
                      local_12f8._8_4_ * fVar23 + fVar22 * local_1458._8_4_));
    local_1378._12_4_ =
         (float)(uVar106 ^
                (uint)(local_1498._12_4_ * fVar31 +
                      local_12f8._12_4_ * fVar30 + fVar29 * local_1458._12_4_));
    fVar48 = (ray->org).field_0.m128[3];
    fVar53 = local_1368._0_4_;
    auVar65._0_4_ = fVar53 * fVar48;
    fVar54 = local_1368._4_4_;
    auVar65._4_4_ = fVar54 * fVar48;
    fVar55 = local_1368._8_4_;
    auVar65._8_4_ = fVar55 * fVar48;
    fVar87 = local_1368._12_4_;
    auVar65._12_4_ = fVar87 * fVar48;
    auVar56 = vcmpps_avx(auVar65,local_1378,1);
    fVar48 = ray->tfar;
    auVar74._0_4_ = fVar53 * fVar48;
    auVar74._4_4_ = fVar54 * fVar48;
    auVar74._8_4_ = fVar55 * fVar48;
    auVar74._12_4_ = fVar87 * fVar48;
    auVar88 = vcmpps_avx(local_1378,auVar74,2);
    auVar78 = ZEXT1664(auVar88);
    auVar56 = vandps_avx(auVar88,auVar56);
    auVar68 = ZEXT1664(auVar56);
    local_1348 = vandps_avx(auVar56,auVar84);
    uVar41 = vmovmskps_avx(local_1348);
    if (uVar41 != 0) {
      local_1308 = local_1498;
      local_12e8 = local_1458._0_8_;
      uStack_12e0 = local_1458._8_8_;
      local_1448._0_8_ = local_1460->scene;
      auVar84 = vrcpps_avx(local_1368);
      fVar48 = auVar84._0_4_;
      auVar66._0_4_ = fVar53 * fVar48;
      fVar53 = auVar84._4_4_;
      auVar66._4_4_ = fVar54 * fVar53;
      fVar54 = auVar84._8_4_;
      auVar66._8_4_ = fVar55 * fVar54;
      fVar55 = auVar84._12_4_;
      auVar66._12_4_ = fVar87 * fVar55;
      auVar75._8_4_ = 0x3f800000;
      auVar75._0_8_ = 0x3f8000003f800000;
      auVar75._12_4_ = 0x3f800000;
      auVar78 = ZEXT1664(auVar75);
      auVar84 = vsubps_avx(auVar75,auVar66);
      fVar48 = fVar48 + fVar48 * auVar84._0_4_;
      fVar53 = fVar53 + fVar53 * auVar84._4_4_;
      fVar54 = fVar54 + fVar54 * auVar84._8_4_;
      fVar55 = fVar55 + fVar55 * auVar84._12_4_;
      local_1318[0] = fVar48 * local_1378._0_4_;
      local_1318[1] = fVar53 * local_1378._4_4_;
      local_1318[2] = fVar54 * local_1378._8_4_;
      local_1318[3] = fVar55 * local_1378._12_4_;
      local_1338._0_4_ = fVar48 * local_1398._0_4_;
      local_1338._4_4_ = fVar53 * local_1398._4_4_;
      local_1338._8_4_ = fVar54 * local_1398._8_4_;
      local_1338._12_4_ = fVar55 * local_1398._12_4_;
      auVar68 = ZEXT1664(local_1338);
      local_1328._0_4_ = fVar48 * local_1388._0_4_;
      local_1328._4_4_ = fVar53 * local_1388._4_4_;
      local_1328._8_4_ = fVar54 * local_1388._8_4_;
      local_1328._12_4_ = fVar55 * local_1388._12_4_;
      uVar39 = (ulong)(uVar41 & 0xff);
      local_1468 = lVar43 + uVar47;
      local_1458 = auVar80;
      do {
        uVar42 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
        local_1488._0_8_ = uVar42;
        local_13f0 = *(uint *)(local_1468 + 0x120 + uVar42 * 4);
        uVar40 = CONCAT44(0,local_13f0);
        local_1498._0_8_ = uVar40;
        local_1430 = *(long *)(*(long *)(local_1448._0_8_ + 0x1e8) + uVar40 * 8);
        if ((*(uint *)(local_1430 + 0x34) & ray->mask) == 0) {
          uVar39 = uVar39 ^ 1L << (uVar42 & 0x3f);
        }
        else {
          local_1458._0_8_ = uVar39;
          if ((local_1460->args->filter == (RTCFilterFunctionN)0x0) &&
             (local_1498._0_8_ = ray, *(long *)(local_1430 + 0x48) == 0)) goto LAB_00e5d122;
          local_1470 = local_1460->args;
          local_13d8.context = local_1460->user;
          local_1408 = *(uint *)(local_1308 + uVar42 * 4);
          auVar84 = ZEXT416(local_1408);
          local_1404 = *(uint *)(local_12f8 + uVar42 * 4);
          auVar56 = ZEXT416(local_1404);
          local_1400 = *(uint *)((long)&local_12e8 + uVar42 * 4);
          auVar88 = ZEXT416(local_1400);
          local_13fc = *(undefined4 *)(local_1338 + uVar42 * 4);
          local_13f8 = *(undefined4 *)(local_1328 + uVar42 * 4);
          local_13f4 = *(undefined4 *)(local_1468 + 0x130 + uVar42 * 4);
          local_13ec = (local_13d8.context)->instID[0];
          local_13e8 = (local_13d8.context)->instPrimID[0];
          fVar48 = ray->tfar;
          ray->tfar = local_1318[uVar42];
          local_149c = -1;
          local_13d8.valid = &local_149c;
          local_13d8.geometryUserPtr = *(void **)(local_1430 + 0x18);
          local_1498._0_8_ = ray;
          local_13d8.hit = (RTCHitN *)&local_1408;
          local_13d8.N = 1;
          local_13d8.ray = (RTCRayN *)ray;
          if (*(code **)(local_1430 + 0x48) == (code *)0x0) {
LAB_00e5d078:
            if ((local_1470->filter == (RTCFilterFunctionN)0x0) ||
               (((local_1470->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT && ((*(byte *)(local_1430 + 0x3e) & 0x40) == 0)))) {
LAB_00e5d122:
              ((Ray *)local_1498._0_8_)->tfar = -INFINITY;
              return;
            }
            auVar78 = ZEXT1664(auVar84);
            auVar83 = ZEXT1664(auVar56);
            auVar86 = ZEXT1664(auVar88);
            (*local_1470->filter)(&local_13d8);
            auVar68._8_56_ = extraout_var_00;
            auVar68._0_8_ = extraout_XMM1_Qa_00;
            if (*local_13d8.valid != 0) goto LAB_00e5d122;
          }
          else {
            auVar78 = ZEXT464(local_1408);
            auVar83 = ZEXT464(local_1404);
            auVar86 = ZEXT464(local_1400);
            (**(code **)(local_1430 + 0x48))(&local_13d8);
            auVar88 = auVar86._0_16_;
            auVar56 = auVar83._0_16_;
            auVar84 = auVar78._0_16_;
            auVar68._8_56_ = extraout_var;
            auVar68._0_8_ = extraout_XMM1_Qa;
            if (*local_13d8.valid != 0) goto LAB_00e5d078;
          }
          *(float *)(local_1498._0_8_ + 0x20) = fVar48;
          uVar39 = local_1458._0_8_ ^ 1L << (local_1488._0_8_ & 0x3f);
          ray = (Ray *)local_1498._0_8_;
        }
      } while (uVar39 != 0);
    }
  }
  local_1428 = local_1428 + 1;
  auVar93 = ZEXT3264(local_11f8);
  auVar95 = ZEXT3264(local_1218);
  auVar98 = ZEXT3264(local_1238);
  auVar103 = ZEXT3264(local_1258);
  auVar108 = ZEXT3264(local_1278);
  auVar109 = ZEXT3264(local_1298);
  auVar91 = ZEXT3264(local_12b8);
  auVar113 = ZEXT3264(local_12d8);
  goto LAB_00e5cb7c;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }